

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::computeQuadTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,Vec3 *p0,Vec3 *p1,IVec3 *dirSwz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pfVar4;
  int i;
  long lVar5;
  Vec3 v3;
  Vec3 v2;
  Vec3 v0;
  Vec3 v1;
  Vec3 f3;
  Vec3 f2;
  Vec3 f1;
  Vector<float,_3> res_6;
  Vector<float,_3> res_9;
  Vec3 f0;
  float local_a0 [4];
  float local_90 [4];
  float local_80 [4];
  float local_70 [4];
  float local_60 [4];
  float local_50 [4];
  float local_40 [4];
  float local_30 [4];
  float local_20 [6];
  
  lVar5 = 0;
  local_40[0] = 0.0;
  local_40[1] = 0.0;
  local_40[2] = 0.0;
  iVar1 = dirSwz->m_data[0];
  iVar2 = dirSwz->m_data[1];
  iVar3 = dirSwz->m_data[2];
  local_20[3] = local_40[iVar1];
  local_20[4] = local_40[iVar2];
  local_20[5] = local_40[iVar3];
  local_50[0] = 0.0;
  local_50[1] = 1.0;
  local_50[2] = 0.0;
  local_40[1] = local_50[iVar2];
  local_40[0] = local_50[iVar1];
  local_40[2] = local_50[iVar3];
  local_60[0] = 1.0;
  local_60[1] = 0.0;
  local_60[2] = 0.0;
  local_50[1] = local_60[iVar2];
  local_50[0] = local_60[iVar1];
  local_50[2] = local_60[iVar3];
  local_80[0] = 1.0;
  local_80[1] = 1.0;
  local_80[2] = 0.0;
  local_60[1] = local_80[iVar2];
  local_60[0] = local_80[iVar1];
  local_60[2] = local_80[iVar3];
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  do {
    local_90[lVar5] = p1->m_data[lVar5] - p0->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar5 = 0;
  do {
    local_70[lVar5] = local_90[lVar5] * local_20[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar5 = 0;
  do {
    local_80[lVar5] = p0->m_data[lVar5] + local_70[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_a0[2] = 0.0;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar5 = 0;
  do {
    local_a0[lVar5] = p1->m_data[lVar5] - p0->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar5 = 0;
  do {
    local_90[lVar5] = local_a0[lVar5] * local_40[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar5 = 0;
  do {
    local_70[lVar5] = p0->m_data[lVar5] + local_90[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_30[2] = 0.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  lVar5 = 0;
  do {
    local_30[lVar5] = p1->m_data[lVar5] - p0->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_a0[2] = 0.0;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar5 = 0;
  do {
    local_a0[lVar5] = local_30[lVar5] * local_50[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar5 = 0;
  do {
    local_90[lVar5] = p0->m_data[lVar5] + local_a0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_20[2] = 0.0;
  local_20[0] = 0.0;
  local_20[1] = 0.0;
  lVar5 = 0;
  do {
    local_20[lVar5] = p1->m_data[lVar5] - p0->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_30[2] = 0.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  lVar5 = 0;
  do {
    local_30[lVar5] = local_20[lVar5] * local_60[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_a0[2] = 0.0;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar5 = 0;
  do {
    local_a0[lVar5] = p0->m_data[lVar5] + local_30[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pfVar4 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar4 = local_80[0];
  pfVar4[1] = local_80[1];
  pfVar4[2] = local_80[2];
  pfVar4[3] = local_70[0];
  pfVar4[4] = local_70[1];
  pfVar4[5] = local_70[2];
  pfVar4[6] = (float)local_90._0_8_;
  pfVar4[7] = SUB84(local_90._0_8_,4);
  pfVar4[8] = local_90[2];
  pfVar4[9] = local_a0[0];
  pfVar4[10] = local_a0[1];
  pfVar4[0xb] = local_a0[2];
  return;
}

Assistant:

void computeQuadTexCoord3D (std::vector<float>& dst, const tcu::Vec3& p0, const tcu::Vec3& p1, const tcu::IVec3& dirSwz)
{
	tcu::Vec3 f0 = tcu::Vec3(0.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f1 = tcu::Vec3(0.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f2 = tcu::Vec3(1.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f3 = tcu::Vec3(1.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);

	tcu::Vec3 v0 = p0 + (p1-p0)*f0;
	tcu::Vec3 v1 = p0 + (p1-p0)*f1;
	tcu::Vec3 v2 = p0 + (p1-p0)*f2;
	tcu::Vec3 v3 = p0 + (p1-p0)*f3;

	dst.resize(4*3);

	dst[0] = v0.x(); dst[ 1] = v0.y(); dst[ 2] = v0.z();
	dst[3] = v1.x(); dst[ 4] = v1.y(); dst[ 5] = v1.z();
	dst[6] = v2.x(); dst[ 7] = v2.y(); dst[ 8] = v2.z();
	dst[9] = v3.x(); dst[10] = v3.y(); dst[11] = v3.z();
}